

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::HandlePHPCoverage
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  size_t sVar1;
  bool bVar2;
  string coverageDir;
  cmParsePHPCoverage cov;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  cmParsePHPCoverage local_40;
  string local_30;
  
  cmParsePHPCoverage::cmParsePHPCoverage(&local_40,cont,(this->super_cmCTestGenericHandler).CTest);
  cmCTest::GetBinaryDir_abi_cxx11_(&local_30,(this->super_cmCTestGenericHandler).CTest);
  std::operator+(&local_60,&local_30,"/xdebugCoverage");
  std::__cxx11::string::~string((string *)&local_30);
  bVar2 = cmsys::SystemTools::FileIsDirectory(&local_60);
  if (bVar2) {
    cmParsePHPCoverage::ReadPHPCoverageDirectory(&local_40,local_60._M_dataplus._M_p);
  }
  sVar1 = (cont->TotalCoverage)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::~string((string *)&local_60);
  return (int)sVar1;
}

Assistant:

int cmCTestCoverageHandler::HandlePHPCoverage(
  cmCTestCoverageHandlerContainer* cont)
{
  cmParsePHPCoverage cov(*cont, this->CTest);
  std::string coverageDir = this->CTest->GetBinaryDir() + "/xdebugCoverage";
  if (cmSystemTools::FileIsDirectory(coverageDir)) {
    cov.ReadPHPCoverageDirectory(coverageDir.c_str());
  }
  return static_cast<int>(cont->TotalCoverage.size());
}